

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImGuiTabBar *this;
  ImGuiTabBar **ppIVar1;
  ImGuiTabItem *this_00;
  uint in_EDX;
  ImGuiTabItem *tab;
  bool ret;
  ImGuiTabBar *tab_bar;
  ImGuiContext *g;
  ImGuiTabItemFlags in_stack_000000d4;
  bool *in_stack_000000d8;
  char *in_stack_000000e0;
  ImGuiTabBar *in_stack_000000e8;
  uint *in_stack_ffffffffffffffb8;
  bool local_1;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    ppIVar1 = ImVector<ImGuiTabBar_*>::back(&GImGui->CurrentTabBar);
    this = *ppIVar1;
    local_1 = TabItemEx(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
    if ((local_1) && ((in_EDX & 8) == 0)) {
      this_00 = ImVector<ImGuiTabItem>::operator[](&this->Tabs,(int)this->LastTabItemIdx);
      ImVector<unsigned_int>::push_back((ImVector<unsigned_int> *)this_00,in_stack_ffffffffffffffb8)
      ;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow->SkipItems)
        return false;

    IM_ASSERT(g.CurrentTabBar.Size > 0 && "Needs to be called between BeginTabBar() and EndTabBar()!");
    ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
    bool ret = TabItemEx(tab_bar, label, p_open, flags);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        g.CurrentWindow->IDStack.push_back(tab->ID);    // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}